

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::GlobalClockFunction::~GlobalClockFunction(GlobalClockFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~GlobalClockFunction((GlobalClockFunction *)0xaef958);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

GlobalClockFunction() :
        SystemSubroutine(KnownSystemName::GlobalClock, SubroutineKind::Function) {}